

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Vector2f __thiscall Rml::Element::GetRelativeOffset(Element *this,BoxArea area)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  
  VVar1 = this->relative_offset_base;
  VVar2 = this->relative_offset_position;
  VVar3 = Box::GetPosition(&this->main_box,area);
  VVar4.x = VVar3.x + VVar2.x + VVar1.x;
  VVar4.y = VVar3.y + VVar2.y + VVar1.y;
  return VVar4;
}

Assistant:

Vector2f Element::GetRelativeOffset(BoxArea area)
{
	return relative_offset_base + relative_offset_position + GetBox().GetPosition(area);
}